

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
* Cat<std::vector<util_tests::(anonymous_namespace)::Tracker,std::allocator<util_tests::(anonymous_namespace)::Tracker>>>
            (vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             *__return_storage_ptr__,
            vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            *v1,vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *v2)

{
  int iVar1;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *pvVar2;
  pointer __n;
  pointer pTVar3;
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *pvVar4;
  ulong uVar5;
  pointer pTVar6;
  pointer pTVar7;
  ulong uVar8;
  pointer pTVar9;
  _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  *this;
  pointer pTVar10;
  long lVar11;
  pointer pTVar12;
  long in_FS_OFFSET;
  
  pvVar2 = *(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
             **)(in_FS_OFFSET + 0x28);
  std::
  vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
  ::reserve(v1,((long)(v2->
                      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(v2->
                      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4) +
               ((long)(v1->
                      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(v1->
                      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4));
  pTVar9 = (v2->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (v2->
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        )._M_impl.super__Vector_impl_data._M_finish;
  pTVar12 = (v1->
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pTVar10 = (v1->
            super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    if (pTVar9 == __n) {
      (__return_storage_ptr__->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_start =
           (v1->
           super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           )._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_finish = pTVar12;
      (__return_storage_ptr__->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10;
      pvVar4 = *(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                 **)(in_FS_OFFSET + 0x28);
      if (pvVar4 == pvVar2) {
        (v1->
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (v1->
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (v1->
        super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return pvVar4;
      }
LAB_00743903:
      __stack_chk_fail();
    }
    if (pTVar12 == pTVar10) {
      pTVar3 = (v1->
               super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar11 = (long)pTVar10 - (long)pTVar3;
      if (lVar11 == 0x7ffffffffffffff0) {
        if (*(vector<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              **)(in_FS_OFFSET + 0x28) == pvVar2) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        goto LAB_00743903;
      }
      uVar5 = lVar11 >> 4;
      uVar8 = uVar5;
      if (pTVar10 == pTVar3) {
        uVar8 = 1;
      }
      this = (_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
              *)(uVar8 + uVar5);
      if ((_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
           *)0x7fffffffffffffe < this) {
        this = (_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *)0x7ffffffffffffff;
      }
      if (CARRY8(uVar8,uVar5)) {
        this = (_Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                *)0x7ffffffffffffff;
      }
      pTVar6 = std::
               _Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
               ::_M_allocate(this,(size_t)__n);
      iVar1 = pTVar9->copies;
      *(Tracker **)((long)pTVar6 + lVar11) = pTVar9->origin;
      *(int *)((long)pTVar6 + lVar11 + 8) = iVar1 + 1;
      pTVar12 = pTVar6;
      for (pTVar7 = pTVar3; pTVar10 != pTVar7; pTVar7 = pTVar7 + 1) {
        iVar1 = pTVar7->copies;
        pTVar12->origin = pTVar7->origin;
        pTVar12->copies = iVar1;
        pTVar12 = pTVar12 + 1;
      }
      if (pTVar3 != (pointer)0x0) {
        operator_delete(pTVar3,(long)(v1->
                                     super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pTVar3);
      }
      pTVar12 = pTVar12 + 1;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_start = pTVar6;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_finish = pTVar12;
      pTVar10 = pTVar6 + (long)this;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar10;
    }
    else {
      iVar1 = pTVar9->copies;
      pTVar12->origin = pTVar9->origin;
      pTVar12->copies = iVar1 + 1;
      pTVar12 = pTVar12 + 1;
      (v1->
      super__Vector_base<util_tests::(anonymous_namespace)::Tracker,_std::allocator<util_tests::(anonymous_namespace)::Tracker>_>
      )._M_impl.super__Vector_impl_data._M_finish = pTVar12;
    }
    pTVar9 = pTVar9 + 1;
  } while( true );
}

Assistant:

inline V Cat(V v1, const V& v2)
{
    v1.reserve(v1.size() + v2.size());
    for (const auto& arg : v2) {
        v1.push_back(arg);
    }
    return v1;
}